

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CanReplaceVariable
          (ScalarReplacementPass *this,Instruction *varInst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *pIVar4;
  Instruction *typeInst;
  Instruction *varInst_local;
  ScalarReplacementPass *this_local;
  
  OVar2 = opt::Instruction::opcode(varInst);
  if (OVar2 == OpVariable) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(varInst,0);
    if (uVar3 == 7) {
      this_00 = Pass::get_def_use_mgr((Pass *)this);
      uVar3 = opt::Instruction::type_id(varInst);
      pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar3);
      bVar1 = CheckTypeAnnotations(this,pIVar4);
      if (bVar1) {
        pIVar4 = GetStorageType(this,varInst);
        bVar1 = CheckType(this,pIVar4);
        if (bVar1) {
          bVar1 = CheckAnnotations(this,varInst);
          if (bVar1) {
            bVar1 = CheckUses(this,varInst);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("varInst->opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x25f,
                "bool spvtools::opt::ScalarReplacementPass::CanReplaceVariable(const Instruction *) const"
               );
}

Assistant:

bool ScalarReplacementPass::CanReplaceVariable(
    const Instruction* varInst) const {
  assert(varInst->opcode() == spv::Op::OpVariable);

  // Can only replace function scope variables.
  if (spv::StorageClass(varInst->GetSingleWordInOperand(0u)) !=
      spv::StorageClass::Function) {
    return false;
  }

  if (!CheckTypeAnnotations(get_def_use_mgr()->GetDef(varInst->type_id()))) {
    return false;
  }

  const Instruction* typeInst = GetStorageType(varInst);
  if (!CheckType(typeInst)) {
    return false;
  }

  if (!CheckAnnotations(varInst)) {
    return false;
  }

  if (!CheckUses(varInst)) {
    return false;
  }

  return true;
}